

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O0

void __thiscall
rengine::AllocationPool<rengine::Node>::deallocate(AllocationPool<rengine::Node> *this,Node *t)

{
  bool bVar1;
  uint pos;
  Node *t_local;
  AllocationPool<rengine::Node> *this_local;
  
  if (this->m_memory == (Node *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x52,
                  "void rengine::AllocationPool<rengine::Node>::deallocate(T *) [T = rengine::Node]"
                 );
  }
  if (this->m_free == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x53,
                  "void rengine::AllocationPool<rengine::Node>::deallocate(T *) [T = rengine::Node]"
                 );
  }
  if (this->m_nextFree == 0) {
    __assert_fail("m_nextFree > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x54,
                  "void rengine::AllocationPool<rengine::Node>::deallocate(T *) [T = rengine::Node]"
                 );
  }
  bVar1 = isAlloctated(this,t);
  if (!bVar1) {
    __assert_fail("isAlloctated(t)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x55,
                  "void rengine::AllocationPool<rengine::Node>::deallocate(T *) [T = rengine::Node]"
                 );
  }
  this->m_nextFree = this->m_nextFree - 1;
  this->m_free[this->m_nextFree] = (uint)(((long)t - (long)this->m_memory) / 0x38);
  (**(t->super_SignalEmitter)._vptr_SignalEmitter)();
  return;
}

Assistant:

void deallocate(T *t) {
        assert(m_memory);
        assert(m_free);
        assert(m_nextFree > 0);
        assert(isAlloctated(t));

        unsigned pos = t - m_memory;

        --m_nextFree;
        m_free[m_nextFree] = pos;

        // Call the destructor...
        t->~T();
    }